

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

void __thiscall llvm::Twine::Twine(Twine *this,char *Str)

{
  bool bVar1;
  char *Str_local;
  Twine *this_local;
  
  this->LHSKind = EmptyKind;
  this->RHSKind = EmptyKind;
  if (*Str == '\0') {
    this->LHSKind = EmptyKind;
  }
  else {
    (this->LHS).cString = Str;
    this->LHSKind = CStringKind;
  }
  bVar1 = isValid(this);
  if (!bVar1) {
    __assert_fail("isValid() && \"Invalid twine!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Twine.h"
                  ,0x113,"llvm::Twine::Twine(const char *)");
  }
  return;
}

Assistant:

Twine(const char *Str) {
      if (Str[0] != '\0') {
        LHS.cString = Str;
        LHSKind = CStringKind;
      } else
        LHSKind = EmptyKind;

      assert(isValid() && "Invalid twine!");
    }